

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packetizer.cpp
# Opt level: O0

size_t __thiscall axl::sl::PacketizerRoot::writeImpl(PacketizerRoot *this,void *p0,size_t size0)

{
  char cVar1;
  char *pcVar2;
  Array<char,_axl::sl::ArrayDetails<char>_> *this_00;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_RDX;
  char *in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  bool bVar3;
  size_t chunkSize_1;
  uint32_t packetSize;
  uint32_t dataSize;
  size_t chunkSize;
  char c;
  char *signature;
  size_t bufferSize;
  size_t size;
  char *p;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_stack_ffffffffffffffa0;
  ulong local_38;
  Array<char,_axl::sl::ArrayDetails<char>_> *local_30;
  char *local_28;
  
  local_38 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  local_30 = in_RDX;
  local_28 = in_RSI;
  while (local_38 < 4) {
    if (local_30 == (Array<char,_axl::sl::ArrayDetails<char>_> *)0x0) {
      return 0xffffffffffffffff;
    }
    cVar1 = *local_28;
    if (cVar1 == *(char *)((long)&writeImpl::signatureBuffer + local_38)) {
      Array<char,_axl::sl::ArrayDetails<char>_>::append
                (in_stack_ffffffffffffffa0,(ValueArg)((ulong)in_RDI >> 0x38),0x13bf3d);
      local_38 = local_38 + 1;
    }
    else if (local_38 != 0) {
      Array<char,_axl::sl::ArrayDetails<char>_>::clear
                ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x13bf5e);
      bVar3 = cVar1 == (char)writeImpl::signatureBuffer;
      if (bVar3) {
        Array<char,_axl::sl::ArrayDetails<char>_>::copy
                  ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_RDI,
                   (EVP_PKEY_CTX *)(ulong)(uint)(int)cVar1,(EVP_PKEY_CTX *)0x1);
      }
      local_38 = (ulong)bVar3;
    }
    local_28 = local_28 + 1;
    local_30 = (Array<char,_axl::sl::ArrayDetails<char>_> *)
               ((long)&local_30[-1].super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count + 7);
  }
  if (local_38 < 8) {
    if (local_30 < (Array<char,_axl::sl::ArrayDetails<char>_> *)(8 - local_38)) {
      Array<char,_axl::sl::ArrayDetails<char>_>::append
                (in_stack_ffffffffffffffa0,(char *)in_RDI,0x13bfef);
      return 0xffffffffffffffff;
    }
    Array<char,_axl::sl::ArrayDetails<char>_>::append
              (in_stack_ffffffffffffffa0,(char *)in_RDI,0x13c010);
    local_30 = (Array<char,_axl::sl::ArrayDetails<char>_> *)((long)local_30 - (long)(8 - local_38));
    local_38 = 8;
  }
  pcVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(in_RDI);
  if (local_38 < *(int *)(pcVar2 + 4) + 8U) {
    this_00 = (Array<char,_axl::sl::ArrayDetails<char>_> *)((*(int *)(pcVar2 + 4) + 8U) - local_38);
    if (local_30 < this_00) {
      Array<char,_axl::sl::ArrayDetails<char>_>::append(this_00,(char *)in_RDI,0x13c091);
      return 0xffffffffffffffff;
    }
    Array<char,_axl::sl::ArrayDetails<char>_>::append(this_00,(char *)in_RDI,0x13c0af);
    local_30 = (Array<char,_axl::sl::ArrayDetails<char>_> *)((long)local_30 - (long)this_00);
  }
  return (long)in_RDX - (long)local_30;
}

Assistant:

size_t
PacketizerRoot::writeImpl(
	const void* p0,
	size_t size0
) {
	const char* p = (char*)p0;
	size_t size = size0;
	size_t bufferSize = m_buffer.getCount();

	static uint32_t signatureBuffer = PacketHdrSignature;
	const char* signature = (char*)&signatureBuffer;

	while (bufferSize < sizeof(uint32_t)) { // append signature byte-by-byte
		if (!size)
			return -1; // all is buffered

		char c = *p;

		if (c == signature[bufferSize]) {
			m_buffer.append(c);
			bufferSize++;
		} else if (bufferSize) {
			m_buffer.clear();
			bufferSize = 0;

			if (c == signature[0]) {
				m_buffer.copy(c);
				bufferSize = 1;
			}
		}

		p++;
		size--;
	}

	if (bufferSize < sizeof(uint64_t)) { // packet size
		size_t chunkSize = sizeof(uint64_t) - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;

		bufferSize = sizeof(uint64_t);
	}

	uint32_t dataSize = ((const uint32_t*)m_buffer.cp()) [1];
	uint32_t packetSize = sizeof(uint64_t) + dataSize;

	if (bufferSize < packetSize) {
		size_t chunkSize = packetSize - bufferSize;
		if (size < chunkSize) {
			m_buffer.append(p, size);
			return -1; // all is buffered
		}

		m_buffer.append(p, chunkSize);
		p += chunkSize;
		size -= chunkSize;
	}

	ASSERT(size0 >= size);
	return size0 - size;
}